

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * __thiscall
tinyformat::format<unsigned_long,unsigned_long,std::__cxx11::string>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,unsigned_long *args,
          unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  ostringstream local_1a8 [8];
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  unsigned_long *args_local_1;
  unsigned_long *args_local;
  char *fmt_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  format<unsigned_long,unsigned_long,std::__cxx11::string>
            ((ostream *)local_1a8,(char *)this,(unsigned_long *)fmt,args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}